

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O2

int Lpk_Resynthesize(Abc_Ntk_t *pNtk,Lpk_Par_t *pPars)

{
  long lVar1;
  Vec_Ptr_t *p;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  void *pvVar7;
  Lpk_Man_t *p_00;
  Vec_Vec_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pAVar11;
  Lpk_Par_t *pLVar12;
  abctime aVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ulong uStack_60;
  ProgressBar *local_58;
  int local_4c;
  
  aVar6 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x202,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkSweep(pNtk,0);
  pvVar7 = Abc_FrameReadLibLut();
  if (pvVar7 == (void *)0x0) {
    uVar2 = Abc_NtkGetFaninMax(pNtk);
  }
  else {
    pvVar7 = Abc_FrameReadLibLut();
    uVar2 = *(uint *)((long)pvVar7 + 8);
  }
  uStack_60 = (ulong)uVar2;
  pPars->nLutSize = uVar2;
  if ((int)uVar2 < 7) {
    if (2 < (int)uVar2) goto LAB_003cd119;
    uStack_60 = 3;
  }
  else {
    uStack_60 = 6;
  }
  pPars->nLutSize = (int)uStack_60;
LAB_003cd119:
  iVar4 = (int)uStack_60;
  uVar3 = iVar4 - 2;
  uVar2 = pPars->nVarsShared;
  if ((int)uVar3 < pPars->nVarsShared) {
    pPars->nVarsShared = uVar3;
    uVar2 = uVar3;
  }
  uVar3 = pPars->nLutsMax;
  for (iVar15 = (iVar4 + -1) * uVar3; 0xf < iVar15; iVar15 = iVar15 + (1 - iVar4)) {
    uVar3 = uVar3 - 1;
    pPars->nLutsMax = uVar3;
  }
  pPars->nVarsMax = iVar15 + 1;
  if (pPars->fVerbose != 0) {
    printf("Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
           (ulong)uVar3,uStack_60,(ulong)(uint)pPars->nLutsOver,(ulong)uVar2);
  }
  iVar4 = Abc_NtkToAig(pNtk);
  if (iVar4 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    return 0;
  }
  if (pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x228,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkLevel(pNtk);
  Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
  p_00 = Lpk_ManStart(pPars);
  p_00->pNtk = pNtk;
  p_00->nNodesTotal = pNtk->nObjCounts[7];
  pVVar8 = Vec_VecStart(pNtk->LevelMax);
  p_00->vLevels = pVVar8;
  if (p_00->pPars->fSatur != 0) {
    pVVar8 = Vec_VecStart(0);
    p_00->vVisited = pVVar8;
  }
  if (pPars->fVerbose != 0) {
    iVar4 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalNets = iVar4;
    p_00->nTotalNodes = pNtk->nObjCounts[7];
  }
  bVar18 = p_00->pPars->fSatur == 0;
  local_58 = (ProgressBar *)0x0;
  local_4c = p_00->nNodesTotal;
  do {
    pVVar10 = pNtk->vObjs;
    if (!bVar18) {
      p = (Vec_Ptr_t *)p_00->vVisited;
      lVar1 = (long)pVVar10->nSize + 1;
      if (p->nSize <= (int)lVar1) {
        iVar4 = pVVar10->nSize + 2;
        pVVar10 = p;
        Vec_PtrGrow(p,iVar4);
        for (lVar16 = (long)p->nSize; lVar16 <= lVar1; lVar16 = lVar16 + 1) {
          pVVar9 = Vec_PtrAlloc((int)pVVar10);
          p->pArray[lVar16] = pVVar9;
        }
        p->nSize = iVar4;
        pVVar10 = pNtk->vObjs;
      }
    }
    iVar4 = pVVar10->nSize;
    if (pPars->fVeryVerbose == 0) {
      local_58 = Extra_ProgressBarStart((FILE *)_stdout,iVar4);
    }
    for (iVar15 = 0; iVar15 < pNtk->vObjs->nSize; iVar15 = iVar15 + 1) {
      pAVar11 = Abc_NtkObj(pNtk,iVar15);
      if (((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) &&
         ((pPars->fFirst == 0 ||
          (0xfffffffd <
           (*(uint *)((long)pAVar11->pNtk->vObjs->pArray[*(pAVar11->vFanouts).pArray] + 0x14) & 0xf)
           - 5)))) {
        iVar5 = pPars->fVeryVerbose;
        if (iVar4 <= iVar15) goto LAB_003cd37f;
        if ((iVar5 == 0) && ((local_58 == (ProgressBar *)0x0 || (local_58->nItemsNext <= iVar15))))
        {
          Extra_ProgressBarUpdate_int(local_58,iVar15,(char *)0x0);
        }
        pLVar12 = p_00->pPars;
        if (pLVar12->fSatur != 0) {
          iVar5 = Lpk_NodeHasChanged(p_00,pAVar11->Id);
          if (iVar5 == 0) goto LAB_003cd372;
          pLVar12 = p_00->pPars;
        }
        p_00->pObj = pAVar11;
        if (pLVar12->fOldAlgo == 0) {
          Lpk_ResynthesizeNodeNew(p_00);
        }
        else {
          Lpk_ResynthesizeNode(p_00);
        }
      }
LAB_003cd372:
    }
    iVar5 = pPars->fVeryVerbose;
LAB_003cd37f:
    if (iVar5 == 0) {
      Extra_ProgressBarStop(local_58);
    }
    if (((((double)(local_4c - pNtk->nObjCounts[7]) * 100.0) / (double)p_00->nNodesTotal < 0.05) ||
        (p_00->pPars->fSatur == 0)) || (pPars->fFirst != 0)) {
      Abc_NtkStopReverseLevels(pNtk);
      if (pPars->fVerbose != 0) {
        iVar4 = Abc_NtkGetTotalFanins(pNtk);
        p_00->nTotalNets2 = iVar4;
        iVar4 = pNtk->nObjCounts[7];
        p_00->nTotalNodes2 = iVar4;
        printf("Node gain = %5d. (%.2f %%)  ",
               ((double)(p_00->nTotalNodes - iVar4) * 100.0) / (double)p_00->nTotalNodes);
        printf("Edge gain = %5d. (%.2f %%)  ",
               ((double)(p_00->nTotalNets - p_00->nTotalNets2) * 100.0) / (double)p_00->nTotalNets);
        printf("Muxes = %4d. Dsds = %4d.",(ulong)(uint)p_00->nMuxes,(ulong)(uint)p_00->nDsds);
        putchar(10);
        printf("Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n",
               (ulong)(uint)p_00->nNodesTotal,(ulong)(uint)p_00->nNodesOver,
               (ulong)(uint)p_00->nCutsTotal,(ulong)(uint)p_00->nCutsUseful,
               (ulong)(uint)p_00->nChanges);
        printf("Non-DSD:");
        piVar14 = p_00->nBlocks + 3;
        for (uVar17 = 3; (long)uVar17 <= (long)pPars->nVarsMax; uVar17 = uVar17 + 1) {
          if (*piVar14 != 0) {
            printf(" %d=%d",uVar17 & 0xffffffff);
          }
          piVar14 = piVar14 + 1;
        }
        iVar4 = 10;
        putchar(10);
        aVar13 = Abc_Clock();
        p_00->timeTotal = aVar13 - aVar6;
        lVar1 = p_00->timeEval;
        p_00->timeEval = lVar1 - p_00->timeMap;
        p_00->timeOther = (aVar13 - aVar6) - (lVar1 + p_00->timeCuts + p_00->timeTruth);
        Abc_Print(iVar4,"%s =","Cuts  ");
        dVar20 = (double)p_00->timeCuts;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s =","Truth ");
        dVar20 = (double)p_00->timeTruth;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s =","CSupps");
        dVar20 = (double)p_00->timeSupps;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s =","Eval  ");
        dVar20 = (double)p_00->timeEval;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s ="," MuxAn");
        dVar20 = (double)p_00->timeEvalMuxAn;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s ="," MuxSp");
        dVar20 = (double)p_00->timeEvalMuxSp;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s ="," DsdAn");
        dVar20 = (double)p_00->timeEvalDsdAn;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s ="," DsdSp");
        dVar20 = (double)p_00->timeEvalDsdSp;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p_00->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p_00->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar4,"%s ="," Other");
        lVar1 = p_00->timeEval;
        dVar19 = (double)(lVar1 - (p_00->timeEvalMuxSp + p_00->timeEvalDsdSp +
                                  p_00->timeEvalMuxAn + p_00->timeEvalDsdAn));
        dVar21 = 0.0;
        if (lVar1 != 0) {
          dVar21 = (dVar19 * 100.0) / (double)lVar1;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar19 / 1000000.0,dVar21);
        Abc_Print(iVar4,"%s =","Map   ");
        dVar21 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar21 = ((double)p_00->timeMap * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p_00->timeMap / 1000000.0,dVar21);
        Abc_Print(iVar4,"%s =","Other ");
        dVar21 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar21 = ((double)p_00->timeOther * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p_00->timeOther / 1000000.0,dVar21);
        Abc_Print(iVar4,"%s =","TOTAL ");
        dVar21 = (double)p_00->timeTotal;
        dVar19 = 0.0;
        if (p_00->timeTotal != 0) {
          dVar19 = (dVar21 * 100.0) / dVar21;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar21 / 1000000.0,dVar19);
      }
      Lpk_ManStop(p_00);
      iVar4 = Abc_NtkCheck(pNtk);
      if (iVar4 == 0) {
        puts("Lpk_Resynthesize: The network check has failed.");
        return 0;
      }
      return 1;
    }
    bVar18 = false;
    local_4c = pNtk->nObjCounts[7];
  } while( true );
}

Assistant:

int Lpk_Resynthesize( Abc_Ntk_t * pNtk, Lpk_Par_t * pPars )
{
    ProgressBar * pProgress = NULL; // Suppress "might be used uninitialized"
    Lpk_Man_t * p;
    Abc_Obj_t * pObj;
    double Delta;
//    int * pnFanouts, nObjMax;
    int i, Iter, nNodes, nNodesPrev;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
 
    // sweep dangling nodes as a preprocessing step
    Abc_NtkSweep( pNtk, 0 );

    // get the number of inputs
    if ( Abc_FrameReadLibLut() )
        pPars->nLutSize = ((If_LibLut_t *)Abc_FrameReadLibLut())->LutMax;
    else
        pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
        pPars->nLutSize = 6;
    if ( pPars->nLutSize < 3 )
        pPars->nLutSize = 3;
    // adjust the number of crossbars based on LUT size
    if ( pPars->nVarsShared > pPars->nLutSize - 2 )
        pPars->nVarsShared = pPars->nLutSize - 2;
    // get the max number of LUTs tried
    pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1; // V = N * (K-1) + 1
    while ( pPars->nVarsMax > 16 )
    {
        pPars->nLutsMax--;
        pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1;

    }
    if ( pPars->fVerbose )
    {
        printf( "Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
            pPars->nLutsMax, pPars->nLutSize, pPars->nLutsOver, pPars->nVarsShared, pPars->nVarsMax );
    }
 

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // start the manager
    p = Lpk_ManStart( pPars );
    p->pNtk = pNtk;
    p->nNodesTotal = Abc_NtkNodeNum(pNtk);
    p->vLevels = Vec_VecStart( pNtk->LevelMax ); 
    if ( p->pPars->fSatur )
        p->vVisited = Vec_VecStart( 0 );
    if ( pPars->fVerbose )
    {
        p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    }
/*
    // save the number of fanouts of all objects
    nObjMax = Abc_NtkObjNumMax( pNtk );
    pnFanouts = ABC_ALLOC( int, nObjMax );
    memset( pnFanouts, 0, sizeof(int) * nObjMax );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pnFanouts[pObj->Id] = Abc_ObjFanoutNum(pObj);
*/

    // iterate over the network
    nNodesPrev = p->nNodesTotal;
    for ( Iter = 1; ; Iter++ )
    {
        // expand storage for changed nodes
        if ( p->pPars->fSatur )
            Vec_VecExpand( p->vVisited, Abc_NtkObjNumMax(pNtk) + 1 );

        // consider all nodes
        nNodes = Abc_NtkObjNumMax(pNtk);
        if ( !pPars->fVeryVerbose )
            pProgress = Extra_ProgressBarStart( stdout, nNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            // skip all except the final node
            if ( pPars->fFirst )
            {
                if ( !Abc_ObjIsCo(Abc_ObjFanout0(pObj)) )
                    continue;
            }
            if ( i >= nNodes )
                break;
            if ( !pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            // skip the nodes that did not change
            if ( p->pPars->fSatur && !Lpk_NodeHasChanged(p, pObj->Id) )
                continue;
            // resynthesize
            p->pObj = pObj;
            if ( p->pPars->fOldAlgo )
                Lpk_ResynthesizeNode( p );
            else
                Lpk_ResynthesizeNodeNew( p );
        }
        if ( !pPars->fVeryVerbose )
            Extra_ProgressBarStop( pProgress );

        // check the increase
        Delta = 100.00 * (nNodesPrev - Abc_NtkNodeNum(pNtk)) / p->nNodesTotal;
        if ( Delta < 0.05 )
            break;
        nNodesPrev = Abc_NtkNodeNum(pNtk);
        if ( !p->pPars->fSatur )
            break;

        if ( pPars->fFirst )
            break;
    }
    Abc_NtkStopReverseLevels( pNtk );
/*
    // report the fanout changes
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i >= nObjMax )
            continue;
        if ( Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] == 0 )
            continue;
        printf( "%d ", Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] );
    }
    printf( "\n" );
*/

    if ( pPars->fVerbose )
    {
//        Cloud_PrintInfo( p->pDsdMan->dd );
        p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);
        printf( "Node gain = %5d. (%.2f %%)  ", 
            p->nTotalNodes-p->nTotalNodes2, 100.0*(p->nTotalNodes-p->nTotalNodes2)/p->nTotalNodes );
        printf( "Edge gain = %5d. (%.2f %%)  ", 
            p->nTotalNets-p->nTotalNets2, 100.0*(p->nTotalNets-p->nTotalNets2)/p->nTotalNets );
        printf( "Muxes = %4d. Dsds = %4d.", p->nMuxes, p->nDsds );
        printf( "\n" );
        printf( "Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n", 
            p->nNodesTotal, p->nNodesOver, p->nCutsTotal, p->nCutsUseful, p->nChanges, Iter, p->nBenefited );

        printf( "Non-DSD:" );
        for ( i = 3; i <= pPars->nVarsMax; i++ )
            if ( p->nBlocks[i] )
                printf( " %d=%d", i, p->nBlocks[i] );
        printf( "\n" );

        p->timeTotal = Abc_Clock() - clk;
        p->timeEval  = p->timeEval  - p->timeMap;
        p->timeOther = p->timeTotal - p->timeCuts - p->timeTruth - p->timeEval - p->timeMap;
        ABC_PRTP( "Cuts  ", p->timeCuts,  p->timeTotal );
        ABC_PRTP( "Truth ", p->timeTruth, p->timeTotal );
        ABC_PRTP( "CSupps", p->timeSupps, p->timeTotal );
        ABC_PRTP( "Eval  ", p->timeEval,  p->timeTotal );
        ABC_PRTP( " MuxAn", p->timeEvalMuxAn, p->timeEval );
        ABC_PRTP( " MuxSp", p->timeEvalMuxSp, p->timeEval );
        ABC_PRTP( " DsdAn", p->timeEvalDsdAn, p->timeEval );
        ABC_PRTP( " DsdSp", p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( " Other", p->timeEval-p->timeEvalMuxAn-p->timeEvalMuxSp-p->timeEvalDsdAn-p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( "Map   ", p->timeMap,   p->timeTotal );
        ABC_PRTP( "Other ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL ", p->timeTotal, p->timeTotal );
    }

    Lpk_ManStop( p );
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Lpk_Resynthesize: The network check has failed.\n" );
        return 0;
    }
    return 1;
}